

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pe.cc
# Opt level: O0

void bloaty::pe::AddCatchAll(PeFile *pe,RangeSink *sink)

{
  string_view file_range;
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> *this;
  InputFile *pIVar2;
  const_pointer pvVar3;
  const_pointer pvVar4;
  size_type sVar5;
  RangeSink *in_RSI;
  PeFile *in_RDI;
  string_view sVar6;
  string_view sVar7;
  long begin;
  char *in_stack_fffffffffffffed8;
  RangeSink *analyzer;
  RangeSink *this_00;
  RangeSink *pRVar8;
  undefined1 in_stack_ffffffffffffff28 [16];
  char *in_stack_ffffffffffffff38;
  RangeSink *in_stack_ffffffffffffff40;
  string_view in_stack_ffffffffffffff48;
  size_t local_a8;
  char *in_stack_ffffffffffffff60;
  char *pcVar9;
  char *in_stack_ffffffffffffff68;
  string_view local_88;
  string_view local_78;
  string_view local_68;
  string_view local_58 [2];
  string_view local_38;
  string_view local_28;
  RangeSink *local_18;
  RangeSink *local_10;
  PeFile *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  bVar1 = PeFile::IsOpen(in_RDI);
  if (!bVar1) {
    __assert_fail("pe.IsOpen()",
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/src/pe.cc",0xcc
                  ,"void bloaty::pe::AddCatchAll(const PeFile &, RangeSink *)");
  }
  local_28 = PeFile::pe_headers(local_8);
  this = (basic_string_view<char,_std::char_traits<char>_> *)
         std::basic_string_view<char,_std::char_traits<char>_>::data(&local_28);
  pIVar2 = RangeSink::input_file(local_10);
  local_38 = InputFile::data(pIVar2);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_38);
  local_18 = (RangeSink *)((long)this - (long)pvVar3);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,in_stack_fffffffffffffed8);
  local_58[0] = PeFile::pe_headers(local_8);
  std::basic_string_view<char,_std::char_traits<char>_>::size(local_58);
  local_68 = PeFile::pe_headers(local_8);
  sVar7._M_str = in_stack_ffffffffffffff68;
  sVar7._M_len = (size_t)in_stack_ffffffffffffff60;
  RangeSink::AddRange(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,in_stack_ffffffffffffff48,
                      in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,sVar7);
  local_78 = PeFile::section_headers(local_8);
  pvVar3 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_78);
  pIVar2 = RangeSink::input_file(local_10);
  local_88 = InputFile::data(pIVar2);
  pvVar4 = std::basic_string_view<char,_std::char_traits<char>_>::data(&local_88);
  local_18 = (RangeSink *)(pvVar3 + -(long)pvVar4);
  analyzer = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,in_stack_fffffffffffffed8);
  this_00 = local_18;
  sVar6 = PeFile::section_headers(local_8);
  local_a8 = sVar6._M_len;
  pcVar9 = sVar6._M_str;
  sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_a8);
  sVar6 = PeFile::section_headers(local_8);
  file_range._M_str = in_stack_ffffffffffffff68;
  file_range._M_len = (size_t)pcVar9;
  RangeSink::AddRange(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,sVar6,
                      in_stack_ffffffffffffff28._8_8_,in_stack_ffffffffffffff28._0_8_,file_range);
  pRVar8 = local_10;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (this,in_stack_fffffffffffffed8);
  pIVar2 = RangeSink::input_file(local_10);
  sVar7 = InputFile::data(pIVar2);
  sVar6._M_str = (char *)pRVar8;
  sVar6._M_len = sVar5;
  RangeSink::AddFileRange(this_00,(char *)analyzer,sVar7,sVar6);
  return;
}

Assistant:

void AddCatchAll(const PeFile& pe, RangeSink* sink) {
  assert(pe.IsOpen());

  auto begin = pe.pe_headers().data() - sink->input_file().data().data();
  sink->AddRange("pe_catchall", "[PE Headers]", begin, pe.pe_headers().size(),
                 pe.pe_headers());

  begin = pe.section_headers().data() - sink->input_file().data().data();
  sink->AddRange("pe_catchall", "[PE Section Headers]", begin,
                 pe.section_headers().size(), pe.section_headers());

  // The last-line fallback to make sure we cover the entire file.
  sink->AddFileRange("pe_catchall", "[Unmapped]", sink->input_file().data());
}